

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O3

ShaderStructCase *
deqp::createStructCase
          (Context *context,char *name,char *description,GLSLVersion glslVersion,bool isVertexCase,
          bool usesTextures,ShaderEvalFunc evalFunc,SetupUniformsFunc setupUniforms,
          LineStream *shaderSrc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider vertShaderSource;
  char *pcVar2;
  mapped_type *pmVar3;
  ShaderStructCase *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  allocator<char> local_111;
  key_type local_110;
  string defaultFragSrc;
  string defaultVertSrc;
  string local_a0;
  string versionDecl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  spParams;
  
  pcVar2 = glu::getGLSLVersionDeclaration(glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&versionDecl,pcVar2,(allocator<char> *)&spParams);
  defaultVertSrc._M_dataplus._M_p = (pointer)&defaultVertSrc.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&defaultVertSrc,versionDecl._M_dataplus._M_p,
             versionDecl._M_dataplus._M_p + versionDecl._M_string_length);
  std::__cxx11::string::append((char *)&defaultVertSrc);
  defaultFragSrc._M_dataplus._M_p = (pointer)&defaultFragSrc.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&defaultFragSrc,versionDecl._M_dataplus._M_p,
             versionDecl._M_dataplus._M_p + versionDecl._M_string_length);
  std::__cxx11::string::append((char *)&defaultFragSrc);
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &spParams._M_t._M_impl.super__Rb_tree_header._M_header;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  spParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (isVertexCase) {
    paVar1 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_1,versionDecl._M_dataplus._M_p,
               versionDecl._M_dataplus._M_p + versionDecl._M_string_length);
    std::__cxx11::string::append((char *)&__str_1);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"HEADER","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&__str_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"COORDS","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&__str_1);
    std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1b825f6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"DST","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&__str_1);
    std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1b8029b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"ASSIGN_POS","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&__str_1);
    std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1b825ff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    this = (ShaderStructCase *)operator_new(0x140);
    pcVar2 = LineStream::str(shaderSrc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar2,&local_111);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_110,&local_a0);
    tcu::StringTemplate::specialize(&__str_1,(StringTemplate *)&local_110,&spParams);
    ShaderStructCase::ShaderStructCase
              (this,context,name,description,true,usesTextures,evalFunc,setupUniforms,
               __str_1._M_dataplus._M_p,defaultFragSrc._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_1,versionDecl._M_dataplus._M_p,
               versionDecl._M_dataplus._M_p + versionDecl._M_string_length);
    std::__cxx11::string::append((char *)&__str_1);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"HEADER","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&__str_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &__str_1.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"COORDS","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&__str_1);
    std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1b82624);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"DST","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&__str_1);
    std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1c82b68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"ASSIGN_POS","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&__str_1);
    std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1aee929);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    this = (ShaderStructCase *)operator_new(0x140);
    vertShaderSource = defaultVertSrc._M_dataplus;
    pcVar2 = LineStream::str(shaderSrc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar2,&local_111);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_110,&local_a0);
    tcu::StringTemplate::specialize(&__str_1,(StringTemplate *)&local_110,&spParams);
    ShaderStructCase::ShaderStructCase
              (this,context,name,description,false,usesTextures,evalFunc,setupUniforms,
               vertShaderSource._M_p,__str_1._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&spParams._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)defaultFragSrc._M_dataplus._M_p != &defaultFragSrc.field_2) {
    operator_delete(defaultFragSrc._M_dataplus._M_p,defaultFragSrc.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)defaultVertSrc._M_dataplus._M_p != &defaultVertSrc.field_2) {
    operator_delete(defaultVertSrc._M_dataplus._M_p,defaultVertSrc.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)versionDecl._M_dataplus._M_p != &versionDecl.field_2) {
    operator_delete(versionDecl._M_dataplus._M_p,versionDecl.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

static ShaderStructCase* createStructCase(Context& context, const char* name, const char* description,
										  glu::GLSLVersion glslVersion, bool isVertexCase, bool usesTextures,
										  ShaderEvalFunc evalFunc, SetupUniformsFunc setupUniforms,
										  const LineStream& shaderSrc)
{
	const std::string versionDecl = glu::getGLSLVersionDeclaration(glslVersion);

	const std::string defaultVertSrc = versionDecl + "\n"
													 "in highp vec4 a_position;\n"
													 "in highp vec4 a_coords;\n"
													 "out mediump vec4 v_coords;\n\n"
													 "void main (void)\n"
													 "{\n"
													 "   v_coords = a_coords;\n"
													 "   gl_Position = a_position;\n"
													 "}\n";
	const std::string defaultFragSrc = versionDecl + "\n"
													 "in mediump vec4 v_color;\n"
													 "layout(location = 0) out mediump vec4 o_color;\n\n"
													 "void main (void)\n"
													 "{\n"
													 "   o_color = v_color;\n"
													 "}\n";

	// Fill in specialization parameters.
	std::map<std::string, std::string> spParams;
	if (isVertexCase)
	{
		spParams["HEADER"] = versionDecl + "\n"
										   "in highp vec4 a_position;\n"
										   "in highp vec4 a_coords;\n"
										   "out mediump vec4 v_color;";
		spParams["COORDS"]	 = "a_coords";
		spParams["DST"]		   = "v_color";
		spParams["ASSIGN_POS"] = "gl_Position = a_position;";
	}
	else
	{
		spParams["HEADER"] = versionDecl + "\n"
										   "in mediump vec4 v_coords;\n"
										   "layout(location = 0) out mediump vec4 o_color;";
		spParams["COORDS"]	 = "v_coords";
		spParams["DST"]		   = "o_color";
		spParams["ASSIGN_POS"] = "";
	}

	if (isVertexCase)
		return new ShaderStructCase(context, name, description, isVertexCase, usesTextures, evalFunc, setupUniforms,
									StringTemplate(shaderSrc.str()).specialize(spParams).c_str(),
									defaultFragSrc.c_str());
	else
		return new ShaderStructCase(context, name, description, isVertexCase, usesTextures, evalFunc, setupUniforms,
									defaultVertSrc.c_str(),
									StringTemplate(shaderSrc.str()).specialize(spParams).c_str());
}